

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

INT32 calc_sqr(NES_APU *apu,int i,UINT32 clocks)

{
  INT32 local_28;
  INT32 local_24;
  INT32 local_1c;
  int v;
  INT32 ret;
  UINT32 clocks_local;
  int i_local;
  NES_APU *apu_local;
  
  apu->scounter[i] = apu->scounter[i] - clocks;
  while (apu->scounter[i] < 0) {
    apu->sphase[i] = apu->sphase[i] + 1U & 0xf;
    apu->scounter[i] = apu->freq[i] + 1 + apu->scounter[i];
  }
  local_1c = 0;
  if (((0 < apu->length_counter[i]) && (7 < apu->freq[i])) && (apu->sfreq[i] < 0x800)) {
    if ((apu->envelope_disable[i] & 1U) == 0) {
      local_24 = apu->envelope_counter[i];
    }
    else {
      local_24 = apu->volume[i];
    }
    if (calc_sqr::sqrtbl[apu->duty[i]][apu->sphase[i]] == 0) {
      local_28 = 0;
    }
    else {
      local_28 = local_24;
    }
    local_1c = local_28;
  }
  return local_1c;
}

Assistant:

static INT32 calc_sqr(NES_APU* apu, int i, UINT32 clocks)
{
	static const INT16 sqrtbl[4][16] = {
		{0, 0, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
		{0, 0, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
		{0, 0, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0},
		{1, 1, 0, 0, 0, 0, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1}
	};
	INT32 ret;

	apu->scounter[i] -= clocks;
	while (apu->scounter[i] < 0)
	{
		apu->sphase[i] = (apu->sphase[i] + 1) & 15;
		apu->scounter[i] += apu->freq[i] + 1;
	}

	ret = 0;
	if (apu->length_counter[i] > 0 &&
		apu->freq[i] >= 8 &&
		apu->sfreq[i] < 0x800
		)
	{
		int v = apu->envelope_disable[i] ? apu->volume[i] : apu->envelope_counter[i];
		ret = sqrtbl[apu->duty[i]][apu->sphase[i]] ? v : 0;
	}
	
	return ret;
}